

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# languageService.cpp
# Opt level: O2

void lsp::LanguageService::start(string *address,uint32_t port)

{
  element_type *peVar1;
  allocator<char> local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  uint32_t local_19c;
  code *local_198 [2];
  code *local_188;
  code *local_180;
  code *local_178 [2];
  code *local_168;
  code *local_160;
  code *local_158 [2];
  code *local_148;
  code *local_140;
  code *local_138 [2];
  code *local_128;
  code *local_120;
  code *local_118 [2];
  code *local_108;
  code *local_100;
  code *local_f8 [2];
  code *local_e8;
  code *local_e0;
  code *local_d8 [2];
  code *local_c8;
  code *local_c0;
  code *local_b8 [2];
  code *local_a8;
  code *local_a0;
  code *local_98 [2];
  code *local_88;
  code *local_80;
  code *local_78 [2];
  code *local_68;
  code *local_60;
  code *local_58 [2];
  code *local_48;
  code *local_40;
  code *local_38 [2];
  code *local_28;
  code *local_20;
  
  local_19c = port;
  std::make_shared<lsp::IOHandler,std::__cxx11::string&,unsigned_int&>(&local_1c0,(uint *)address);
  std::__shared_ptr<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&ioHandler_.super___shared_ptr<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2> *)&local_1c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c0._M_string_length);
  std::make_shared<lsp::MessageParser>();
  std::__shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2> *)&local_1c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c0._M_string_length);
  std::make_shared<lsp::XmlParser>();
  std::__shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&xmlParser_.super___shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<lsp::XmlParser,_(__gnu_cxx::_Lock_policy)2> *)&local_1c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c0._M_string_length);
  peVar1 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"initialized",&local_1c1);
  local_38[1] = (code *)0x0;
  local_38[0] = notification_initialized;
  local_20 = std::
             _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
             ::_M_manager;
  MessageParser::register_notification_callback(peVar1,&local_1c0,(notification_callback *)local_38)
  ;
  std::_Function_base::~_Function_base((_Function_base *)local_38);
  std::__cxx11::string::~string((string *)&local_1c0);
  peVar1 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"exit",&local_1c1);
  local_58[1] = (code *)0x0;
  local_58[0] = notification_exit;
  local_40 = std::
             _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
             ::_M_manager;
  MessageParser::register_notification_callback(peVar1,&local_1c0,(notification_callback *)local_58)
  ;
  std::_Function_base::~_Function_base((_Function_base *)local_58);
  std::__cxx11::string::~string((string *)&local_1c0);
  peVar1 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"workspace/didChangeConfiguration",&local_1c1);
  local_78[1] = (code *)0x0;
  local_78[0] = notification_workspace_didChangeConfiguration;
  local_60 = std::
             _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_jsonrpcpp::Parameter_&),_void_(*)(const_jsonrpcpp::Parameter_&)>
             ::_M_manager;
  MessageParser::register_notification_callback(peVar1,&local_1c0,(notification_callback *)local_78)
  ;
  std::_Function_base::~_Function_base((_Function_base *)local_78);
  std::__cxx11::string::~string((string *)&local_1c0);
  peVar1 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"initialize",&local_1c1);
  local_98[1] = (code *)0x0;
  local_98[0] = request_initialize;
  local_80 = std::
             _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
             ::_M_manager;
  MessageParser::register_request_callback(peVar1,&local_1c0,(request_callback *)local_98);
  std::_Function_base::~_Function_base((_Function_base *)local_98);
  std::__cxx11::string::~string((string *)&local_1c0);
  peVar1 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"shutdown",&local_1c1);
  local_b8[1] = (code *)0x0;
  local_b8[0] = request_shutdown;
  local_a0 = std::
             _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
             ::_M_manager;
  MessageParser::register_request_callback(peVar1,&local_1c0,(request_callback *)local_b8);
  std::_Function_base::~_Function_base((_Function_base *)local_b8);
  std::__cxx11::string::~string((string *)&local_1c0);
  peVar1 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"textDocument/definition",&local_1c1);
  local_d8[1] = (code *)0x0;
  local_d8[0] = request_textDocument_definition;
  local_c0 = std::
             _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
             ::_M_manager;
  MessageParser::register_request_callback(peVar1,&local_1c0,(request_callback *)local_d8);
  std::_Function_base::~_Function_base((_Function_base *)local_d8);
  std::__cxx11::string::~string((string *)&local_1c0);
  peVar1 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"textDocument/references",&local_1c1);
  local_f8[1] = (code *)0x0;
  local_f8[0] = request_textDocument_references;
  local_e0 = std::
             _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
             ::_M_manager;
  MessageParser::register_request_callback(peVar1,&local_1c0,(request_callback *)local_f8);
  std::_Function_base::~_Function_base((_Function_base *)local_f8);
  std::__cxx11::string::~string((string *)&local_1c0);
  peVar1 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"textDocument/hover",&local_1c1);
  local_118[1] = (code *)0x0;
  local_118[0] = request_textDocument_hover;
  local_100 = std::
              _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
              ::_M_manager;
  MessageParser::register_request_callback(peVar1,&local_1c0,(request_callback *)local_118);
  std::_Function_base::~_Function_base((_Function_base *)local_118);
  std::__cxx11::string::~string((string *)&local_1c0);
  peVar1 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"treeView/getChildren",&local_1c1);
  local_138[1] = (code *)0x0;
  local_138[0] = request_treeView_getChildren;
  local_120 = std::
              _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
              ::_M_manager;
  MessageParser::register_request_callback(peVar1,&local_1c0,(request_callback *)local_138);
  std::_Function_base::~_Function_base((_Function_base *)local_138);
  std::__cxx11::string::~string((string *)&local_1c0);
  peVar1 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"textDocument/goToOwner",&local_1c1);
  local_158[1] = (code *)0x0;
  local_158[0] = request_textDocument_owner;
  local_140 = std::
              _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
              ::_M_manager;
  MessageParser::register_request_callback(peVar1,&local_1c0,(request_callback *)local_158);
  std::_Function_base::~_Function_base((_Function_base *)local_158);
  std::__cxx11::string::~string((string *)&local_1c0);
  peVar1 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"treeView/getNearestShortname",&local_1c1);
  local_178[1] = (code *)0x0;
  local_178[0] = request_treeView_getNearestShortname;
  local_160 = std::
              _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
              ::_M_invoke;
  local_168 = std::
              _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
              ::_M_manager;
  MessageParser::register_request_callback(peVar1,&local_1c0,(request_callback *)local_178);
  std::_Function_base::~_Function_base((_Function_base *)local_178);
  std::__cxx11::string::~string((string *)&local_1c0);
  peVar1 = messageParser_.super___shared_ptr<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"treeView/getParentElement",&local_1c1);
  local_198[1] = (code *)0x0;
  local_198[0] = request_treeView_getParentElement;
  local_180 = std::
              _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
              ::_M_invoke;
  local_188 = std::
              _Function_handler<std::shared_ptr<jsonrpcpp::Response>_(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&),_std::shared_ptr<jsonrpcpp::Response>_(*)(const_jsonrpcpp::Id_&,_const_jsonrpcpp::Parameter_&)>
              ::_M_manager;
  MessageParser::register_request_callback(peVar1,&local_1c0,(request_callback *)local_198);
  std::_Function_base::~_Function_base((_Function_base *)local_198);
  std::__cxx11::string::~string((string *)&local_1c0);
  run();
  return;
}

Assistant:

void lsp::LanguageService::start(std::string address, uint32_t port)
{
    ioHandler_ = std::make_shared<lsp::IOHandler>(address, port);
    messageParser_ = std::make_shared<lsp::MessageParser>();
    xmlParser_ = std::make_shared<XmlParser>();

    //register Callbacks here
    messageParser_->register_notification_callback("initialized", lsp::LanguageService::notification_initialized);
    messageParser_->register_notification_callback("exit", lsp::LanguageService::notification_exit);
    messageParser_->register_notification_callback("workspace/didChangeConfiguration", lsp::LanguageService::notification_workspace_didChangeConfiguration);
    messageParser_->register_request_callback("initialize", lsp::LanguageService::request_initialize);
    messageParser_->register_request_callback("shutdown", lsp::LanguageService::request_shutdown);
    messageParser_->register_request_callback("textDocument/definition", lsp::LanguageService::request_textDocument_definition);
    messageParser_->register_request_callback("textDocument/references", lsp::LanguageService::request_textDocument_references);
    messageParser_->register_request_callback("textDocument/hover", lsp::LanguageService::request_textDocument_hover);
    messageParser_->register_request_callback("treeView/getChildren", lsp::LanguageService::request_treeView_getChildren);
    messageParser_->register_request_callback("textDocument/goToOwner", lsp::LanguageService::request_textDocument_owner);
    messageParser_->register_request_callback("treeView/getNearestShortname", lsp::LanguageService::request_treeView_getNearestShortname);
    messageParser_->register_request_callback("treeView/getParentElement", lsp::LanguageService::request_treeView_getParentElement);

    //begin the main run loop
    run();
}